

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O0

void __thiscall script_p2sh_tests::AreInputsStandard::test_method(AreInputsStandard *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  span<const_unsigned_char,_18446744073709551615UL> b_06;
  span<const_unsigned_char,_18446744073709551615UL> b_07;
  span<const_unsigned_char,_18446744073709551615UL> b_08;
  span<const_unsigned_char,_18446744073709551615UL> b_09;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  iterator mapInputs;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffd648;
  direct_or_indirect *in_stack_ffffffffffffd650;
  char *in_stack_ffffffffffffd658;
  PKHash *in_stack_ffffffffffffd660;
  CMutableTransaction *in_stack_ffffffffffffd668;
  FillableSigningProvider *in_stack_ffffffffffffd670;
  undefined4 in_stack_ffffffffffffd678;
  opcodetype in_stack_ffffffffffffd67c;
  int in_stack_ffffffffffffd680;
  uint in_stack_ffffffffffffd684;
  undefined7 in_stack_ffffffffffffd688;
  undefined7 uVar5;
  undefined1 in_stack_ffffffffffffd68f;
  undefined1 uVar6;
  iterator in_stack_ffffffffffffd690;
  CKey *pCVar7;
  iterator in_stack_ffffffffffffd698;
  CKey *pCVar8;
  undefined4 in_stack_ffffffffffffd6a0;
  int in_stack_ffffffffffffd6a4;
  FillableSigningProvider *in_stack_ffffffffffffd6a8;
  CCoinsViewCache *in_stack_ffffffffffffd6b0;
  SignatureData *in_stack_ffffffffffffd6d8;
  CCoinsViewCache *in_stack_ffffffffffffd6e0;
  CTransaction *in_stack_ffffffffffffd6e8;
  CTransaction *tx;
  CKey *local_2560;
  int i_3;
  uint i_2;
  int i_1;
  int i;
  AreInputsStandard *this_local;
  direct_or_indirect local_24d8 [3];
  const_string local_2480 [2];
  lazy_ostream local_2460 [2];
  assertion_result local_2440 [4];
  CMutableTransaction txToNonStd2;
  direct_or_indirect local_23a0 [3];
  const_string local_2348 [2];
  lazy_ostream local_2328 [2];
  assertion_result local_2308 [4];
  CMutableTransaction txToNonStd1;
  direct_or_indirect local_2268 [3];
  const_string local_2210 [2];
  lazy_ostream local_21f0 [2];
  assertion_result local_21d0 [6];
  const_string local_2138 [2];
  lazy_ostream local_2118 [2];
  assertion_result local_20f8 [2];
  const_string local_20c0 [2];
  lazy_ostream local_20a0 [2];
  assertion_result local_2080 [2];
  const_string local_2048 [2];
  lazy_ostream local_2028 [2];
  assertion_result local_2008 [2];
  CMutableTransaction txTo;
  const_string local_1f98 [2];
  lazy_ostream local_1f78 [2];
  assertion_result local_1f58 [2];
  const_string local_1f20 [2];
  lazy_ostream local_1f00 [2];
  assertion_result local_1ee0 [2];
  const_string local_1ea8 [2];
  lazy_ostream local_1e88 [2];
  assertion_result local_1e68 [4];
  const_string local_1e08 [2];
  lazy_ostream local_1de8 [2];
  assertion_result local_1dc8 [12];
  const_string local_1ca0 [2];
  lazy_ostream local_1c80 [2];
  assertion_result local_1c60 [2];
  CMutableTransaction txFrom;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  const_string local_1bd8 [2];
  lazy_ostream local_1bb8 [2];
  assertion_result local_1b98 [2];
  CCoinsView coinsDummy;
  undefined8 local_1a55;
  undefined8 uStack_1a4d;
  undefined8 local_1a45;
  undefined8 uStack_1a3d;
  undefined8 local_186d;
  undefined8 uStack_1865;
  undefined8 local_185d;
  undefined8 uStack_1855;
  SignatureData empty_c;
  SignatureData empty_b;
  SignatureData empty;
  undefined8 local_a55;
  undefined8 local_a4d;
  undefined8 local_a45;
  undefined8 local_a3d;
  CScript twentySigops;
  CScript sixteenSigops;
  CScript fifteenSigops;
  CScript oneAndTwo;
  CScript pay1of3;
  CScript pay1;
  CKey key [6];
  undefined1 auStack_268 [8];
  FillableSigningProvider keystore;
  CCoinsViewCache coins;
  
  local_2008[0].m_message.px = (element_type *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCoinsView::CCoinsView((CCoinsView *)in_stack_ffffffffffffd648);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)in_stack_ffffffffffffd698.ptr,
             (CCoinsView *)in_stack_ffffffffffffd690.ptr,(bool)in_stack_ffffffffffffd68f);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd648);
  local_2560 = key;
  do {
    CKey::CKey((CKey *)in_stack_ffffffffffffd648);
    local_2560 = local_2560 + 1;
  } while (local_2560 != (CKey *)auStack_268);
  for (i = 0; i < 6; i = i + 1) {
    CKey::MakeNewKey((CKey *)in_stack_ffffffffffffd658,
                     SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
                 in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
                 (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                 CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
                 (const_string *)in_stack_ffffffffffffd670);
      FillableSigningProvider::AddKey(in_stack_ffffffffffffd670,(CKey *)in_stack_ffffffffffffd668);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd658,
                 SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
                 in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
                 in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
      in_stack_ffffffffffffd648 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b98,local_1bb8,local_1bd8,0x11f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffd648);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd648);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd648);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
             CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680));
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd648,
               (value_type *)0x9f39d9);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd668,
             (size_type)in_stack_ffffffffffffd660);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  PKHash::PKHash(in_stack_ffffffffffffd660,(CPubKey *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,(PKHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd6a8,
               (CScript *)CONCAT44(in_stack_ffffffffffffd6a4,in_stack_ffffffffffffd6a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c60,local_1c80,local_1ca0,299,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  GetScriptForMultisig
            ((int)((ulong)in_stack_ffffffffffffd698.ptr >> 0x20),
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd690.ptr);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffd660,(CScript *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,
             (ScriptHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 1000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 2000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 3000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_00._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_00._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_00._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_00);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_01._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_01._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_01._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_02._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_02._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_02._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_02);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_03._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_03._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_03._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_03._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_03);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_04._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_04._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_04._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_04._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_04);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd6a8,
               (CScript *)CONCAT44(in_stack_ffffffffffffd6a4,in_stack_ffffffffffffd6a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1dc8,local_1de8,local_1e08,0x13c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffd660,(CScript *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,
             (ScriptHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 4000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  for (i_2 = 0; i_2 < 0xf; i_2 = i_2 + 1) {
    CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
    ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688));
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &in_stack_ffffffffffffd650->indirect_contents);
    b_05._M_ptr._4_4_ = in_stack_ffffffffffffd684;
    b_05._M_ptr._0_4_ = in_stack_ffffffffffffd680;
    b_05._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
    b_05._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
    CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_05);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  }
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd6a8,
               (CScript *)CONCAT44(in_stack_ffffffffffffd6a4,in_stack_ffffffffffffd6a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e68,local_1e88,local_1ea8,0x145,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffd660,(CScript *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,
             (ScriptHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 5000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd6a8,
               (CScript *)CONCAT44(in_stack_ffffffffffffd6a4,in_stack_ffffffffffffd6a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ee0,local_1f00,local_1f20,0x14b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffd660,(CScript *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,
             (ScriptHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 5000;
  CScript::CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd6a8,
               (CScript *)CONCAT44(in_stack_ffffffffffffd6a4,in_stack_ffffffffffffd6a0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f58,local_1f78,local_1f98,0x14f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffd660,(CScript *)in_stack_ffffffffffffd658);
  uVar6 = (undefined1)((uint)in_stack_ffffffffffffd6a0 >> 0x18);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,
             (ScriptHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 6000;
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680));
  AddCoins(in_stack_ffffffffffffd6b0,(CTransaction *)in_stack_ffffffffffffd6a8,
           in_stack_ffffffffffffd6a4,(bool)uVar6);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd668,
             (size_type)in_stack_ffffffffffffd660);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  PKHash::PKHash(in_stack_ffffffffffffd660,(CPubKey *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,(PKHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffd668->vin,(size_type)in_stack_ffffffffffffd660);
  for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
    pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                        (size_type)in_stack_ffffffffffffd650);
    (pvVar4->prevout).n = i_3;
    CMutableTransaction::GetHash(in_stack_ffffffffffffd668);
    pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                        (size_type)in_stack_ffffffffffffd650);
    *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_a55;
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_a4d;
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_a45;
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_a3d;
  }
  SignatureData::SignatureData(in_stack_ffffffffffffd6d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    SignSignature((SigningProvider *)in_stack_ffffffffffffd698.ptr,
                  (CTransaction *)in_stack_ffffffffffffd690.ptr,
                  (CMutableTransaction *)
                  CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
                  in_stack_ffffffffffffd684,in_stack_ffffffffffffd680,
                  (SignatureData *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2008,local_2028,local_2048,0x160,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SignatureData::SignatureData(in_stack_ffffffffffffd6d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    SignSignature((SigningProvider *)in_stack_ffffffffffffd698.ptr,
                  (CTransaction *)in_stack_ffffffffffffd690.ptr,
                  (CMutableTransaction *)
                  CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
                  in_stack_ffffffffffffd684,in_stack_ffffffffffffd680,
                  (SignatureData *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2080,local_20a0,local_20c0,0x162,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SignatureData::SignatureData(in_stack_ffffffffffffd6d8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    SignSignature((SigningProvider *)in_stack_ffffffffffffd698.ptr,
                  (CTransaction *)in_stack_ffffffffffffd690.ptr,
                  (CMutableTransaction *)
                  CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
                  in_stack_ffffffffffffd684,in_stack_ffffffffffffd680,
                  (SignatureData *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_20f8,local_2118,local_2138,0x164,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                      in_stack_ffffffffffffd67c);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),in_stack_ffffffffffffd698
             ,in_stack_ffffffffffffd690,(allocator_type *)in_stack_ffffffffffffd670);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_06._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_06._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_06._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_06._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_06);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),in_stack_ffffffffffffd698
             ,in_stack_ffffffffffffd690,(allocator_type *)in_stack_ffffffffffffd670);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_07._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_07._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_07._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_07._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_07);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    ::AreInputsStandard(in_stack_ffffffffffffd6e8,in_stack_ffffffffffffd6e0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_21d0,local_21f0,local_2210,0x16b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    local_2268[0]._4_4_ =
         GetP2SHSigOpCount((CTransaction *)
                           CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                           (CCoinsViewCache *)
                           CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    local_2268[0]._0_4_ = 0x16;
    in_stack_ffffffffffffd658 = "22U";
    in_stack_ffffffffffffd650 = local_2268;
    in_stack_ffffffffffffd648 = "GetP2SHSigOpCount(CTransaction(txTo), coins)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_2268[0].direct + 0x18,local_2268[0].direct + 8,0x16d,1,2,
               local_2268[0].direct + 4);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd668,
             (size_type)in_stack_ffffffffffffd660);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  PKHash::PKHash(in_stack_ffffffffffffd660,(CPubKey *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,(PKHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffd668->vin,(size_type)in_stack_ffffffffffffd660);
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  (pvVar4->prevout).n = 5;
  CMutableTransaction::GetHash(in_stack_ffffffffffffd668);
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_185d;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_1855;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_186d
  ;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_1865;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),in_stack_ffffffffffffd698
             ,in_stack_ffffffffffffd690,(allocator_type *)in_stack_ffffffffffffd670);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_08._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_08._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_08._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_08._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    ::AreInputsStandard(in_stack_ffffffffffffd6e8,in_stack_ffffffffffffd6e0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2308,local_2328,local_2348,0x178,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    local_23a0[0]._4_4_ =
         GetP2SHSigOpCount((CTransaction *)
                           CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                           (CCoinsViewCache *)
                           CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    local_23a0[0]._0_4_ = 0x10;
    in_stack_ffffffffffffd658 = "16U";
    in_stack_ffffffffffffd650 = local_23a0;
    in_stack_ffffffffffffd648 = "GetP2SHSigOpCount(CTransaction(txToNonStd1), coins)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_23a0[0].direct + 0x18,local_23a0[0].direct + 8,0x179,1,2,
               local_23a0[0].direct + 4);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd668,
             (size_type)in_stack_ffffffffffffd660);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd670);
  PKHash::PKHash(in_stack_ffffffffffffd660,(CPubKey *)in_stack_ffffffffffffd658);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd658,(PKHash *)&in_stack_ffffffffffffd650->indirect_contents);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd648);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  CScript::operator=((CScript *)in_stack_ffffffffffffd658,
                     (CScript *)&in_stack_ffffffffffffd650->indirect_contents);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd648);
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  pvVar3->nValue = 1000;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&in_stack_ffffffffffffd668->vin,(size_type)in_stack_ffffffffffffd660);
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  (pvVar4->prevout).n = 6;
  CMutableTransaction::GetHash(in_stack_ffffffffffffd668);
  tx = (CTransaction *)&txToNonStd2;
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
                      (size_type)in_stack_ffffffffffffd650);
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_1a45;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_1a3d;
  *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_1a55
  ;
  *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_1a4d;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffd658,
             (size_type)in_stack_ffffffffffffd650);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  mapInputs = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         &in_stack_ffffffffffffd650->indirect_contents);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),in_stack_ffffffffffffd698
             ,in_stack_ffffffffffffd690,(allocator_type *)in_stack_ffffffffffffd670);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd658,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in_stack_ffffffffffffd650->indirect_contents);
  b_09._M_ptr._4_4_ = in_stack_ffffffffffffd684;
  b_09._M_ptr._0_4_ = in_stack_ffffffffffffd680;
  b_09._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd688;
  b_09._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd68f;
  CScript::operator<<((CScript *)in_stack_ffffffffffffd668,b_09);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd658);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffd648);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    ::AreInputsStandard(tx,(CCoinsViewCache *)mapInputs.ptr);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd658,
               SUB81((ulong)in_stack_ffffffffffffd650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    in_stack_ffffffffffffd648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2440,local_2460,local_2480,0x184,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd648);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (const_string *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
               CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678),
               (const_string *)in_stack_ffffffffffffd670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffd650->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffd648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd658,
               in_stack_ffffffffffffd650->direct,(unsigned_long)in_stack_ffffffffffffd648);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffd68f,in_stack_ffffffffffffd688),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680))
    ;
    local_24d8[0]._4_4_ =
         GetP2SHSigOpCount((CTransaction *)
                           CONCAT44(in_stack_ffffffffffffd684,in_stack_ffffffffffffd680),
                           (CCoinsViewCache *)
                           CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
    local_24d8[0]._0_4_ = 0x14;
    in_stack_ffffffffffffd658 = "20U";
    in_stack_ffffffffffffd650 = local_24d8;
    in_stack_ffffffffffffd648 = "GetP2SHSigOpCount(CTransaction(txToNonStd2), coins)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_24d8[0].direct + 0x18,local_24d8[0].direct + 8,0x185,1,2,
               local_24d8[0].direct + 4);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffd648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd648);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  SignatureData::~SignatureData((SignatureData *)in_stack_ffffffffffffd648);
  SignatureData::~SignatureData((SignatureData *)in_stack_ffffffffffffd648);
  SignatureData::~SignatureData((SignatureData *)in_stack_ffffffffffffd648);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd648);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd648);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd658);
  pCVar7 = key;
  pCVar8 = (CKey *)auStack_268;
  do {
    uVar5 = SUB87(pCVar8 + -1,0);
    uVar6 = (undefined1)((ulong)(pCVar8 + -1) >> 0x38);
    CKey::~CKey((CKey *)in_stack_ffffffffffffd648);
    pCVar8 = (CKey *)CONCAT17(uVar6,uVar5);
  } while (pCVar8 != pCVar7);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd648);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_ffffffffffffd648);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(AreInputsStandard)
{
    CCoinsView coinsDummy;
    CCoinsViewCache coins(&coinsDummy);
    FillableSigningProvider keystore;
    CKey key[6];
    for (int i = 0; i < 6; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }
    std::vector<CPubKey> keys;
    keys.reserve(3);
    for (int i = 0; i < 3; i++)
        keys.push_back(key[i].GetPubKey());

    CMutableTransaction txFrom;
    txFrom.vout.resize(7);

    // First three are standard:
    CScript pay1 = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    BOOST_CHECK(keystore.AddCScript(pay1));
    CScript pay1of3 = GetScriptForMultisig(1, keys);

    txFrom.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(pay1)); // P2SH (OP_CHECKSIG)
    txFrom.vout[0].nValue = 1000;
    txFrom.vout[1].scriptPubKey = pay1; // ordinary OP_CHECKSIG
    txFrom.vout[1].nValue = 2000;
    txFrom.vout[2].scriptPubKey = pay1of3; // ordinary OP_CHECKMULTISIG
    txFrom.vout[2].nValue = 3000;

    // vout[3] is complicated 1-of-3 AND 2-of-3
    // ... that is OK if wrapped in P2SH:
    CScript oneAndTwo;
    oneAndTwo << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIGVERIFY;
    oneAndTwo << OP_2 << ToByteVector(key[3].GetPubKey()) << ToByteVector(key[4].GetPubKey()) << ToByteVector(key[5].GetPubKey());
    oneAndTwo << OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(oneAndTwo));
    txFrom.vout[3].scriptPubKey = GetScriptForDestination(ScriptHash(oneAndTwo));
    txFrom.vout[3].nValue = 4000;

    // vout[4] is max sigops:
    CScript fifteenSigops; fifteenSigops << OP_1;
    for (unsigned i = 0; i < MAX_P2SH_SIGOPS; i++)
        fifteenSigops << ToByteVector(key[i%3].GetPubKey());
    fifteenSigops << OP_15 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(fifteenSigops));
    txFrom.vout[4].scriptPubKey = GetScriptForDestination(ScriptHash(fifteenSigops));
    txFrom.vout[4].nValue = 5000;

    // vout[5/6] are non-standard because they exceed MAX_P2SH_SIGOPS
    CScript sixteenSigops; sixteenSigops << OP_16 << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(sixteenSigops));
    txFrom.vout[5].scriptPubKey = GetScriptForDestination(ScriptHash(sixteenSigops));
    txFrom.vout[5].nValue = 5000;
    CScript twentySigops; twentySigops << OP_CHECKMULTISIG;
    BOOST_CHECK(keystore.AddCScript(twentySigops));
    txFrom.vout[6].scriptPubKey = GetScriptForDestination(ScriptHash(twentySigops));
    txFrom.vout[6].nValue = 6000;

    AddCoins(coins, CTransaction(txFrom), 0);

    CMutableTransaction txTo;
    txTo.vout.resize(1);
    txTo.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));

    txTo.vin.resize(5);
    for (int i = 0; i < 5; i++)
    {
        txTo.vin[i].prevout.n = i;
        txTo.vin[i].prevout.hash = txFrom.GetHash();
    }
    SignatureData empty;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 0, SIGHASH_ALL, empty));
    SignatureData empty_b;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 1, SIGHASH_ALL, empty_b));
    SignatureData empty_c;
    BOOST_CHECK(SignSignature(keystore, CTransaction(txFrom), txTo, 2, SIGHASH_ALL, empty_c));
    // SignSignature doesn't know how to sign these. We're
    // not testing validating signatures, so just create
    // dummy signatures that DO include the correct P2SH scripts:
    txTo.vin[3].scriptSig << OP_11 << OP_11 << std::vector<unsigned char>(oneAndTwo.begin(), oneAndTwo.end());
    txTo.vin[4].scriptSig << std::vector<unsigned char>(fifteenSigops.begin(), fifteenSigops.end());

    BOOST_CHECK(::AreInputsStandard(CTransaction(txTo), coins));
    // 22 P2SH sigops for all inputs (1 for vin[0], 6 for vin[3], 15 for vin[4]
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txTo), coins), 22U);

    CMutableTransaction txToNonStd1;
    txToNonStd1.vout.resize(1);
    txToNonStd1.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd1.vout[0].nValue = 1000;
    txToNonStd1.vin.resize(1);
    txToNonStd1.vin[0].prevout.n = 5;
    txToNonStd1.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd1.vin[0].scriptSig << std::vector<unsigned char>(sixteenSigops.begin(), sixteenSigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd1), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd1), coins), 16U);

    CMutableTransaction txToNonStd2;
    txToNonStd2.vout.resize(1);
    txToNonStd2.vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[1].GetPubKey()));
    txToNonStd2.vout[0].nValue = 1000;
    txToNonStd2.vin.resize(1);
    txToNonStd2.vin[0].prevout.n = 6;
    txToNonStd2.vin[0].prevout.hash = txFrom.GetHash();
    txToNonStd2.vin[0].scriptSig << std::vector<unsigned char>(twentySigops.begin(), twentySigops.end());

    BOOST_CHECK(!::AreInputsStandard(CTransaction(txToNonStd2), coins));
    BOOST_CHECK_EQUAL(GetP2SHSigOpCount(CTransaction(txToNonStd2), coins), 20U);
}